

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef>
          (writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string_view<char,_std::char_traits<char>_> *first,TypeDef *rest)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t __n;
  void *__buf;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  size_type offset;
  TypeDef *rest_local;
  basic_string_view<char,_std::char_traits<char>_> *first_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  offset = (size_type)rest;
  rest_local = (TypeDef *)first;
  first_local = value;
  value_local = (string_view *)this;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0);
  if (local_30 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string_view<char>, Rest = <winmd::reader::TypeDef>]"
                 );
  }
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr(first_local,0,local_30);
  write(this,(int)&local_40,local_40._M_str,(size_t)rest);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](first_local,local_30);
  sVar1 = local_30;
  if (*pvVar2 == '^') {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(first_local);
    __n = sVar3 - 1;
    if (sVar1 == __n) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string_view<char>, Rest = <winmd::reader::TypeDef>]"
                   );
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (first_local,local_30 + 1);
    write(this,(int)*pvVar2,__buf,__n);
    local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (first_local,local_30 + 2,0xffffffffffffffff);
    write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef>
              (this,&local_50,(basic_string_view<char,_std::char_traits<char>_> *)rest_local,
               (TypeDef *)offset);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](first_local,local_30)
    ;
    if (*pvVar2 == '%') {
      write(this,(int)rest_local,__buf_00,(size_t)rest);
    }
    else {
      cppwinrt::writer::write_code((writer *)this,(string_view *)rest_local);
    }
    local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (first_local,local_30 + 1,0xffffffffffffffff);
    write_segment<winmd::reader::TypeDef>(this,&local_60,(TypeDef *)offset);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }